

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O0

double deqp::gles31::Functional::FmaCase::fma(double __x,double __y,double __z)

{
  double dVar1;
  double dVar2;
  Interval *pIVar3;
  Interval **ppIVar4;
  double *pdVar5;
  undefined8 *puVar6;
  bool bVar7;
  deBool dVar8;
  FloatFormat *this;
  float in_ESI;
  Interval *in_RDI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  bool local_639;
  bool local_601;
  Interval local_558;
  Interval local_540;
  Interval *local_528;
  Interval *pIStack_520;
  Interval *local_518;
  Interval **local_510;
  Interval *tmp_9;
  double dStack_500;
  double local_4f8;
  double *local_4f0;
  Interval *tmp_8;
  Interval tmp_hi__4;
  Interval tmp_lo__4;
  Interval *tmp_dst__4;
  undefined1 local_4a8 [4];
  ScopedRoundingMode tmp_ctx__4;
  Interval local_490;
  Interval local_478;
  Interval local_460;
  double local_448;
  double local_440;
  double local_438;
  double local_430;
  double local_428;
  double local_420;
  Interval *local_418;
  Interval *pIStack_410;
  Interval *local_408;
  Interval **local_400;
  Interval *tmp_7;
  double dStack_3f0;
  double local_3e8;
  double *local_3e0;
  Interval *tmp_6;
  Interval tmp_hi__3;
  Interval tmp_lo__3;
  Interval *tmp_dst__3;
  double dStack_398;
  ScopedRoundingMode tmp_ctx__3;
  Interval *local_380;
  Interval *pIStack_378;
  Interval *local_370;
  Interval **local_368;
  Interval *tmp_5;
  double dStack_358;
  double local_350;
  double *local_348;
  Interval *tmp_4;
  Interval tmp_hi__2;
  Interval tmp_lo__2;
  Interval *tmp_dst__2;
  double dStack_300;
  ScopedRoundingMode tmp_ctx__2;
  Interval *local_2e8;
  Interval *pIStack_2e0;
  Interval *local_2d8;
  Interval **local_2d0;
  Interval *tmp_3;
  double dStack_2c0;
  double local_2b8;
  double *local_2b0;
  Interval *tmp_2;
  Interval tmp_hi__1;
  Interval tmp_lo__1;
  Interval *tmp_dst__1;
  undefined1 auStack_268 [4];
  ScopedRoundingMode tmp_ctx__1;
  double local_260;
  double local_258;
  Interval *local_250;
  Interval *pIStack_248;
  Interval *local_240;
  Interval **local_238;
  Interval *tmp_1;
  double dStack_228;
  double local_220;
  undefined8 *local_218;
  Interval *tmp;
  Interval tmp_hi_;
  undefined1 auStack_1e8 [8];
  Interval tmp_lo_;
  Interval *tmp_dst_;
  undefined1 auStack_1c0 [4];
  ScopedRoundingMode tmp_ctx_;
  Interval res;
  Interval prod;
  Interval prod3;
  Interval prod2;
  Interval prod1;
  Interval prod0;
  undefined1 local_118 [8];
  Interval ic;
  undefined1 local_e8 [8];
  Interval ib;
  undefined1 local_b8 [8];
  Interval ia;
  FloatFormat *format;
  FloatFormat FStack_70;
  FloatFormat FStack_48;
  float local_18;
  float local_14;
  float c_local;
  float b_local;
  float a_local;
  Precision precision_local;
  
  local_18 = SUB84(__z,0);
  c_local = SUB84(__x,0);
  local_14 = SUB84(__y,0);
  b_local = in_ESI;
  tcu::FloatFormat::FloatFormat((FloatFormat *)&format,0,0,7,false,YES,MAYBE,MAYBE);
  tcu::FloatFormat::FloatFormat(&FStack_70,-0xd,0xd,9,false,MAYBE,MAYBE,MAYBE);
  tcu::FloatFormat::FloatFormat(&FStack_48,-0x7e,0x7f,0x17,true,MAYBE,YES,MAYBE);
  this = de::getSizedArrayElement<3,3,tcu::FloatFormat>
                   ((FloatFormat_0_ *)&format,(Type_conflict1)b_local);
  ia.m_hi = (double)this;
  tcu::Interval::Interval((Interval *)&ib.m_hi,(double)c_local);
  tcu::FloatFormat::convert((Interval *)local_b8,this,(Interval *)&ib.m_hi);
  dVar1 = ia.m_hi;
  tcu::Interval::Interval((Interval *)&ic.m_hi,(double)local_14);
  tcu::FloatFormat::convert((Interval *)local_e8,(FloatFormat *)dVar1,(Interval *)&ic.m_hi);
  dVar1 = ia.m_hi;
  tcu::Interval::Interval((Interval *)&prod0.m_hi,(double)local_18);
  tcu::FloatFormat::convert((Interval *)local_118,(FloatFormat *)dVar1,(Interval *)&prod0.m_hi);
  tcu::Interval::Interval((Interval *)&prod1.m_hi);
  tcu::Interval::Interval((Interval *)&prod2.m_hi);
  tcu::Interval::Interval((Interval *)&prod3.m_hi);
  tcu::Interval::Interval((Interval *)&prod.m_hi);
  tcu::Interval::Interval((Interval *)&res.m_hi);
  tcu::Interval::Interval((Interval *)auStack_1c0);
  do {
    tcu::ScopedRoundingMode::ScopedRoundingMode((ScopedRoundingMode *)((long)&tmp_dst_ + 4));
    tmp_lo_.m_hi = (double)&prod1.m_hi;
    tcu::Interval::Interval((Interval *)auStack_1e8);
    tcu::Interval::Interval((Interval *)&tmp);
    local_218 = (undefined8 *)auStack_1e8;
    deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
    dVar1 = tcu::Interval::lo((Interval *)local_b8);
    dVar2 = tcu::Interval::lo((Interval *)local_e8);
    tcu::Interval::Interval((Interval *)&tmp_1,dVar1 * dVar2);
    puVar6 = local_218;
    local_218[2] = local_220;
    dVar1 = dStack_228;
    *puVar6 = tmp_1;
    puVar6[1] = dVar1;
    local_238 = &tmp;
    deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
    dVar1 = tcu::Interval::lo((Interval *)local_b8);
    dVar2 = tcu::Interval::lo((Interval *)local_e8);
    tcu::Interval::Interval((Interval *)&local_250,dVar1 * dVar2);
    ppIVar4 = local_238;
    local_238[2] = local_240;
    pIVar3 = pIStack_248;
    *ppIVar4 = local_250;
    ppIVar4[1] = pIVar3;
    tcu::Interval::operator|((Interval *)auStack_268,(Interval *)auStack_1e8,(Interval *)&tmp);
    dVar1 = tmp_lo_.m_hi;
    *(undefined8 *)tmp_lo_.m_hi = _auStack_268;
    *(double *)((long)dVar1 + 8) = local_260;
    *(double *)((long)dVar1 + 0x10) = local_258;
    tcu::ScopedRoundingMode::~ScopedRoundingMode((ScopedRoundingMode *)((long)&tmp_dst_ + 4));
    dVar8 = ::deGetFalse();
  } while (dVar8 != 0);
  do {
    tcu::ScopedRoundingMode::ScopedRoundingMode((ScopedRoundingMode *)((long)&tmp_dst__1 + 4));
    tcu::Interval::Interval((Interval *)&tmp_hi__1.m_hi);
    tcu::Interval::Interval((Interval *)&tmp_2);
    local_2b0 = &tmp_hi__1.m_hi;
    deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
    dVar1 = tcu::Interval::lo((Interval *)local_b8);
    dVar2 = tcu::Interval::hi((Interval *)local_e8);
    tcu::Interval::Interval((Interval *)&tmp_3,dVar1 * dVar2);
    pdVar5 = local_2b0;
    local_2b0[2] = local_2b8;
    dVar1 = dStack_2c0;
    *pdVar5 = (double)tmp_3;
    pdVar5[1] = dVar1;
    local_2d0 = &tmp_2;
    deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
    dVar1 = tcu::Interval::lo((Interval *)local_b8);
    dVar2 = tcu::Interval::hi((Interval *)local_e8);
    tcu::Interval::Interval((Interval *)&local_2e8,dVar1 * dVar2);
    ppIVar4 = local_2d0;
    local_2d0[2] = local_2d8;
    pIVar3 = pIStack_2e0;
    *ppIVar4 = local_2e8;
    ppIVar4[1] = pIVar3;
    tcu::Interval::operator|
              ((Interval *)&stack0xfffffffffffffd00,(Interval *)&tmp_hi__1.m_hi,(Interval *)&tmp_2);
    prod2.m_hi = dStack_300;
    tcu::ScopedRoundingMode::~ScopedRoundingMode((ScopedRoundingMode *)((long)&tmp_dst__1 + 4));
    dVar8 = ::deGetFalse();
  } while (dVar8 != 0);
  do {
    tcu::ScopedRoundingMode::ScopedRoundingMode((ScopedRoundingMode *)((long)&tmp_dst__2 + 4));
    tcu::Interval::Interval((Interval *)&tmp_hi__2.m_hi);
    tcu::Interval::Interval((Interval *)&tmp_4);
    local_348 = &tmp_hi__2.m_hi;
    deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
    dVar1 = tcu::Interval::hi((Interval *)local_b8);
    dVar2 = tcu::Interval::lo((Interval *)local_e8);
    tcu::Interval::Interval((Interval *)&tmp_5,dVar1 * dVar2);
    pdVar5 = local_348;
    local_348[2] = local_350;
    dVar1 = dStack_358;
    *pdVar5 = (double)tmp_5;
    pdVar5[1] = dVar1;
    local_368 = &tmp_4;
    deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
    dVar1 = tcu::Interval::hi((Interval *)local_b8);
    dVar2 = tcu::Interval::lo((Interval *)local_e8);
    tcu::Interval::Interval((Interval *)&local_380,dVar1 * dVar2);
    ppIVar4 = local_368;
    local_368[2] = local_370;
    pIVar3 = pIStack_378;
    *ppIVar4 = local_380;
    ppIVar4[1] = pIVar3;
    tcu::Interval::operator|
              ((Interval *)&stack0xfffffffffffffc68,(Interval *)&tmp_hi__2.m_hi,(Interval *)&tmp_4);
    prod3.m_hi = dStack_398;
    tcu::ScopedRoundingMode::~ScopedRoundingMode((ScopedRoundingMode *)((long)&tmp_dst__2 + 4));
    dVar8 = ::deGetFalse();
  } while (dVar8 != 0);
  do {
    tcu::ScopedRoundingMode::ScopedRoundingMode((ScopedRoundingMode *)((long)&tmp_dst__3 + 4));
    tcu::Interval::Interval((Interval *)&tmp_hi__3.m_hi);
    tcu::Interval::Interval((Interval *)&tmp_6);
    local_3e0 = &tmp_hi__3.m_hi;
    deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
    dVar1 = tcu::Interval::hi((Interval *)local_b8);
    dVar2 = tcu::Interval::hi((Interval *)local_e8);
    tcu::Interval::Interval((Interval *)&tmp_7,dVar1 * dVar2);
    pdVar5 = local_3e0;
    local_3e0[2] = local_3e8;
    dVar1 = dStack_3f0;
    *pdVar5 = (double)tmp_7;
    pdVar5[1] = dVar1;
    local_400 = &tmp_6;
    deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
    dVar1 = tcu::Interval::hi((Interval *)local_b8);
    dVar2 = tcu::Interval::hi((Interval *)local_e8);
    tcu::Interval::Interval((Interval *)&local_418,dVar1 * dVar2);
    ppIVar4 = local_400;
    local_400[2] = local_408;
    pIVar3 = pIStack_410;
    *ppIVar4 = local_418;
    ppIVar4[1] = pIVar3;
    tcu::Interval::operator|((Interval *)&local_430,(Interval *)&tmp_hi__3.m_hi,(Interval *)&tmp_6);
    prod.m_hi = local_430;
    prod3._0_8_ = local_428;
    prod3.m_lo = local_420;
    tcu::ScopedRoundingMode::~ScopedRoundingMode((ScopedRoundingMode *)((long)&tmp_dst__3 + 4));
    dVar8 = ::deGetFalse();
    dVar1 = ia.m_hi;
  } while (dVar8 != 0);
  tcu::Interval::operator|((Interval *)local_4a8,(Interval *)&prod1.m_hi,(Interval *)&prod2.m_hi);
  tcu::Interval::operator|(&local_490,(Interval *)local_4a8,(Interval *)&prod3.m_hi);
  tcu::Interval::operator|(&local_478,&local_490,(Interval *)&prod.m_hi);
  bVar7 = tcu::Interval::isFinite((Interval *)local_b8);
  local_601 = false;
  if (bVar7) {
    local_601 = tcu::Interval::isFinite((Interval *)local_e8);
  }
  tcu::FloatFormat::roundOut(&local_460,(FloatFormat *)dVar1,&local_478,local_601);
  tcu::FloatFormat::convert((Interval *)&local_448,(FloatFormat *)dVar1,&local_460);
  res.m_hi = local_448;
  prod._0_8_ = local_440;
  prod.m_lo = local_438;
  do {
    tcu::ScopedRoundingMode::ScopedRoundingMode((ScopedRoundingMode *)((long)&tmp_dst__4 + 4));
    tcu::Interval::Interval((Interval *)&tmp_hi__4.m_hi);
    tcu::Interval::Interval((Interval *)&tmp_8);
    local_4f0 = &tmp_hi__4.m_hi;
    deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
    dVar1 = tcu::Interval::lo((Interval *)&res.m_hi);
    dVar2 = tcu::Interval::lo((Interval *)local_118);
    tcu::Interval::Interval((Interval *)&tmp_9,dVar1 + dVar2);
    pdVar5 = local_4f0;
    local_4f0[2] = local_4f8;
    dVar1 = dStack_500;
    *pdVar5 = (double)tmp_9;
    pdVar5[1] = dVar1;
    local_510 = &tmp_8;
    deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
    dVar1 = tcu::Interval::hi((Interval *)&res.m_hi);
    dVar2 = tcu::Interval::hi((Interval *)local_118);
    tcu::Interval::Interval((Interval *)&local_528,dVar1 + dVar2);
    ppIVar4 = local_510;
    local_510[2] = local_518;
    pIVar3 = pIStack_520;
    *ppIVar4 = local_528;
    ppIVar4[1] = pIVar3;
    tcu::Interval::operator|(&local_540,(Interval *)&tmp_hi__4.m_hi,(Interval *)&tmp_8);
    auStack_1c0[0] = local_540.m_hasNaN;
    stack0xfffffffffffffe41 = local_540._1_7_;
    res._0_8_ = local_540.m_lo;
    res.m_lo = local_540.m_hi;
    tcu::ScopedRoundingMode::~ScopedRoundingMode((ScopedRoundingMode *)((long)&tmp_dst__4 + 4));
    dVar8 = ::deGetFalse();
    dVar1 = ia.m_hi;
  } while (dVar8 != 0);
  bVar7 = tcu::Interval::isFinite((Interval *)&res.m_hi);
  local_639 = false;
  if (bVar7) {
    local_639 = tcu::Interval::isFinite((Interval *)local_118);
  }
  tcu::FloatFormat::roundOut(&local_558,(FloatFormat *)dVar1,(Interval *)auStack_1c0,local_639);
  tcu::FloatFormat::convert(in_RDI,(FloatFormat *)dVar1,&local_558);
  return (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
}

Assistant:

static tcu::Interval fma (glu::Precision precision, float a, float b, float c)
	{
		const tcu::FloatFormat formats[] =
		{
			//				 minExp		maxExp		mantissa	exact,		subnormals	infinities	NaN
			tcu::FloatFormat(0,			0,			7,			false,		tcu::YES,	tcu::MAYBE,	tcu::MAYBE),
			tcu::FloatFormat(-13,		13,			9,			false,		tcu::MAYBE,	tcu::MAYBE,	tcu::MAYBE),
			tcu::FloatFormat(-126,		127,		23,			true,		tcu::MAYBE, tcu::YES,	tcu::MAYBE)
		};
		const tcu::FloatFormat&	format	= de::getSizedArrayElement<glu::PRECISION_LAST>(formats, precision);
		const tcu::Interval		ia		= format.convert(a);
		const tcu::Interval		ib		= format.convert(b);
		const tcu::Interval		ic		= format.convert(c);
		tcu::Interval			prod0;
		tcu::Interval			prod1;
		tcu::Interval			prod2;
		tcu::Interval			prod3;
		tcu::Interval			prod;
		tcu::Interval			res;

		TCU_SET_INTERVAL(prod0, tmp, tmp = ia.lo() * ib.lo());
		TCU_SET_INTERVAL(prod1, tmp, tmp = ia.lo() * ib.hi());
		TCU_SET_INTERVAL(prod2, tmp, tmp = ia.hi() * ib.lo());
		TCU_SET_INTERVAL(prod3, tmp, tmp = ia.hi() * ib.hi());

		prod = format.convert(format.roundOut(prod0 | prod1 | prod2 | prod3, ia.isFinite() && ib.isFinite()));

		TCU_SET_INTERVAL_BOUNDS(res, tmp,
								tmp = prod.lo() + ic.lo(),
								tmp = prod.hi() + ic.hi());

		return format.convert(format.roundOut(res, prod.isFinite() && ic.isFinite()));
	}